

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O0

int_type __thiscall
asio::basic_streambuf<std::allocator<char>_>::overflow
          (basic_streambuf<std::allocator<char>_> *this,int_type c)

{
  bool bVar1;
  char_type cVar2;
  long lVar3;
  long lVar4;
  char_type *pcVar5;
  int_type in_ESI;
  long in_RDI;
  size_t buffer_size;
  size_t in_stack_00000048;
  basic_streambuf<std::allocator<char>_> *in_stack_00000050;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  int_type local_18;
  int_type local_14 [4];
  int_type local_4;
  
  local_14[0] = in_ESI;
  local_18 = std::char_traits<char>::eof();
  bVar1 = std::char_traits<char>::eq_int_type(local_14,&local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_4 = std::char_traits<char>::not_eof
                        ((int_type *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  else {
    lVar3 = std::streambuf::pptr();
    lVar4 = std::streambuf::epptr();
    if (lVar3 == lVar4) {
      lVar3 = std::streambuf::pptr();
      lVar4 = std::streambuf::gptr();
      if (((ulong)(lVar3 - lVar4) < *(ulong *)(in_RDI + 0x40)) &&
         ((ulong)(*(long *)(in_RDI + 0x40) - (lVar3 - lVar4)) < 0x80)) {
        reserve(in_stack_00000050,in_stack_00000048);
      }
      else {
        reserve(in_stack_00000050,in_stack_00000048);
      }
    }
    cVar2 = std::char_traits<char>::to_char_type(local_14);
    pcVar5 = (char_type *)std::streambuf::pptr();
    *pcVar5 = cVar2;
    std::streambuf::pbump((int)in_RDI);
    local_4 = local_14[0];
  }
  return local_4;
}

Assistant:

int_type overflow(int_type c)
  {
    if (!traits_type::eq_int_type(c, traits_type::eof()))
    {
      if (pptr() == epptr())
      {
        std::size_t buffer_size = pptr() - gptr();
        if (buffer_size < max_size_ && max_size_ - buffer_size < buffer_delta)
        {
          reserve(max_size_ - buffer_size);
        }
        else
        {
          reserve(buffer_delta);
        }
      }

      *pptr() = traits_type::to_char_type(c);
      pbump(1);
      return c;
    }

    return traits_type::not_eof(c);
  }